

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_slice<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t from,uint32_t to)

{
  ref<immutable::rrb<int,_false,_6>_> local_30;
  ref<immutable::rrb<int,_false,_6>_> local_28;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t to_local;
  uint32_t from_local;
  ref<immutable::rrb<int,_false,_6>_> *rrb_local;
  
  local_20 = to;
  local_1c = from;
  _to_local = rrb;
  rrb_local = (ref<immutable::rrb<int,_false,_6>_> *)this;
  ref<immutable::rrb<int,_false,_6>_>::ref(&local_30,rrb);
  rrb_details::rrb_drop_right<int,false,6>((rrb_details *)&local_28,&local_30,local_20);
  rrb_details::rrb_drop_left<int,false,6>((rrb_details *)this,&local_28,local_1c);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_28);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_30);
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_slice(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t from, uint32_t to)
    {
    using namespace rrb_details;
    return rrb_drop_left(rrb_drop_right(rrb, to), from);
    }